

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ADIOS.cpp
# Opt level: O0

void __thiscall adios2::core::ADIOS::ProcessUserConfig(ADIOS *this)

{
  bool bVar1;
  char *pcVar2;
  string cfgFile;
  string homePath;
  string *in_stack_00000468;
  UserOptions *in_stack_00000470;
  string *in_stack_00000478;
  Comm *in_stack_00000480;
  string *in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  string local_58 [8];
  char *in_stack_ffffffffffffffb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb8;
  string local_28 [40];
  
  std::__cxx11::string::string(local_28);
  pcVar2 = getenv("HOME");
  std::__cxx11::string::operator=(local_28,pcVar2);
  SetUserOptionDefaults((ADIOS *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
  std::operator+(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  bVar1 = adios2sys::SystemTools::FileExists(in_stack_ffffffffffffff88);
  if (bVar1) {
    helper::ParseUserOptionsFile
              (in_stack_00000480,in_stack_00000478,in_stack_00000470,in_stack_00000468);
  }
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string(local_28);
  return;
}

Assistant:

void ADIOS::ProcessUserConfig()
{
    // read config parameters from config file
    std::string homePath;
#ifdef _WIN32
    homePath = getenv("HOMEPATH");
#else
    homePath = getenv("HOME");
#endif
    SetUserOptionDefaults();
    const std::string cfgFile = homePath + "/.config/adios2/adios2.yaml";
    if (adios2sys::SystemTools::FileExists(cfgFile))
    {
        helper::ParseUserOptionsFile(m_Comm, cfgFile, m_UserOptions, homePath);
    }
}